

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chemkinReader.cpp
# Opt level: O0

ssize_t __thiscall IO::ChemkinReader::read(ChemkinReader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined1 extraout_AL;
  undefined7 extraout_var;
  string local_128;
  undefined1 local_108 [8];
  TransportParser transportParser;
  string local_b8;
  undefined1 local_98 [8];
  ThermoParser thermoParser;
  ChemkinReader *this_local;
  
  thermoParser.globalHighT_ = (double)this;
  readGlobalUnits(this);
  readElements(this);
  readSpecies(this);
  std::__cxx11::string::string((string *)&local_b8,(string *)&this->thermfile_);
  ThermoParser::ThermoParser((ThermoParser *)local_98,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  ThermoParser::parse((ThermoParser *)local_98,&this->species_);
  bVar1 = std::operator!=(&this->transfile_,"NOT READ");
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_128,(string *)&this->transfile_);
    TransportParser::TransportParser((TransportParser *)local_108,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    TransportParser::parse((TransportParser *)local_108,&this->species_);
    TransportParser::~TransportParser((TransportParser *)local_108);
  }
  readReactions(this);
  ThermoParser::~ThermoParser((ThermoParser *)local_98);
  return CONCAT71(extraout_var,extraout_AL);
}

Assistant:

void IO::ChemkinReader::read()
{

    readGlobalUnits();

    readElements();
    readSpecies();

    ThermoParser thermoParser(thermfile_);
    thermoParser.parse(species_);

    if (transfile_ != "NOT READ")
    {
        TransportParser transportParser(transfile_);
        transportParser.parse(species_);
    }

    readReactions();

}